

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall luna::CodeGenerateVisitor::DeleteCurrentFunction(CodeGenerateVisitor *this)

{
  GenerateFunction *pGVar1;
  GenerateBlock *pGVar2;
  GenerateBlock *block;
  
  pGVar1 = this->current_function_;
  while (pGVar2 = pGVar1->current_block_, pGVar2 != (GenerateBlock *)0x0) {
    pGVar1->current_block_ = pGVar2->parent_;
    std::
    _Hashtable<luna::String_*,_std::pair<luna::String_*const,_luna::LocalNameInfo>,_std::allocator<std::pair<luna::String_*const,_luna::LocalNameInfo>_>,_std::__detail::_Select1st,_std::equal_to<luna::String_*>,_std::hash<luna::String_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&(pGVar2->names_)._M_h);
    operator_delete(pGVar2);
  }
  this->current_function_ = pGVar1->parent_;
  std::__cxx11::_List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>::_M_clear
            (&(pGVar1->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>);
  operator_delete(pGVar1);
  return;
}

Assistant:

void DeleteCurrentFunction()
        {
            auto function = current_function_;

            // Delete all blocks in function
            while (function->current_block_)
            {
                auto block = function->current_block_;
                function->current_block_ = block->parent_;
                delete block;
            }

            current_function_ = function->parent_;
            delete function;
        }